

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O0

void __thiscall FIX::message_order::message_order(message_order *this,int first,...)

{
  char in_AL;
  int iVar1;
  int *piVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_150;
  int *local_130;
  int local_11c;
  int local_108 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_58;
  int i;
  shared_array<int> local_48;
  uint local_38;
  undefined4 local_34;
  va_list arguments;
  int local_18;
  int size;
  int field;
  int first_local;
  message_order *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  this->m_mode = group;
  this->m_delim = 0;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  shared_array<int>::shared_array(&this->m_groupOrder);
  this->m_largest = 0;
  arguments[0].reg_save_area._4_4_ = 0;
  this->m_delim = first;
  this->m_largest = first;
  arguments[0].overflow_arg_area = local_108;
  arguments[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_18 = first;
  while (local_18 != 0) {
    if (local_18 < this->m_largest) {
      local_11c = this->m_largest;
    }
    else {
      local_11c = local_18;
    }
    this->m_largest = local_11c;
    arguments[0].reg_save_area._4_4_ = arguments[0].reg_save_area._4_4_ + 1;
    if (local_38 < 0x29) {
      local_130 = (int *)((long)arguments[0].overflow_arg_area + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_130 = (int *)arguments[0]._0_8_;
      arguments[0]._0_8_ = arguments[0]._0_8_ + 8;
    }
    local_18 = *local_130;
  }
  if (arguments[0].reg_save_area._4_4_ == 0) {
    this->m_largest = 0;
    this->m_delim = 0;
  }
  else {
    shared_array<int>::create(&local_48,(long)(this->m_largest + 1));
    shared_array<int>::operator=(&this->m_groupOrder,&local_48);
    shared_array<int>::~shared_array(&local_48);
    arguments[0].overflow_arg_area = local_108;
    arguments[0]._0_8_ = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_58 = 0;
    local_18 = first;
    while (local_18 != 0) {
      iVar1 = local_58 + 1;
      local_58 = iVar1;
      piVar2 = shared_array::operator_cast_to_int_((shared_array *)&this->m_groupOrder);
      piVar2[local_18] = iVar1;
      if (local_38 < 0x29) {
        local_150 = (int *)((long)(int)local_38 + (long)arguments[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_150 = (int *)arguments[0]._0_8_;
        arguments[0]._0_8_ = arguments[0]._0_8_ + 8;
      }
      local_18 = *local_150;
    }
  }
  return;
}

Assistant:

message_order::message_order(int first, ...)
    : m_mode(group),
      m_delim(0),
      m_largest(0) {
  int field = first;
  int size = 0;
  m_largest = m_delim = first;

  va_list arguments;
  va_start(arguments, first);
  while (field != 0) {
    m_largest = m_largest > field ? m_largest : field;

    size++;
    field = va_arg(arguments, int);
  }

  if (size) {
    m_groupOrder = shared_array<int>::create(m_largest + 1);

    va_start(arguments, first);
    field = first;
    int i = 0;
    while (field != 0) {
      m_groupOrder[field] = ++i;
      field = va_arg(arguments, int);
    }
  } else {
    m_largest = 0;
    m_delim = 0;
  }

  va_end(arguments);
}